

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *pHVar1;
  undefined8 uVar2;
  pair<int,_int> pVar3;
  long lVar4;
  int i;
  int iVar5;
  int i_1;
  iterator *piVar6;
  sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar7;
  undefined8 *puVar8;
  pair<const_std::pair<int,_int>,_int> *ppVar9;
  undefined8 *puVar10;
  pair<int,_int> *ppVar11;
  pointer ppVar12;
  byte bVar13;
  pair<const_std::pair<int,_int>,_int> pVar14;
  size_type old_count;
  pair<google::sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  iterator in_stack_fffffffffffffdf8;
  iterator in_stack_fffffffffffffe40;
  uint local_174;
  HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_170;
  HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_168;
  size_type local_160;
  pair<const_std::pair<int,_int>,_int> local_158 [6];
  undefined1 local_110 [80];
  sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_c0;
  undefined8 local_78 [9];
  
  bVar13 = 0;
  pVar14 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  ((type *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info + 0xc))->first = pVar14.first.first;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0x10) = pVar14.first.second;
  iVar5 = 10;
  do {
    local_158[0] = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(iVar5);
    google::
    sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::insert_noresize((pair<google::sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                       *)local_110,&this_00->rep,local_158);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 2000);
  local_170 = &(this->
               super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_;
  local_160 = *(size_type *)
               ((long)&(this->
                       super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       ).
                       super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.
                       super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.rep.table + 0x38);
  iVar5 = 10;
  local_168 = this;
  do {
    local_174 = 1;
    pVar14 = UniqueObjectHelper<std::pair<std::pair<int,int>const,int>>(iVar5);
    local_c0.ht = (sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)pVar14.first;
    pVar3 = (pair<int,_int>)
            google::
            sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ::erase(&this_00->rep,(key_type *)&local_c0);
    local_158[0].first = pVar3;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_110,"1u","this->ht_.erase(this->UniqueKey(i))",&local_174,
               (unsigned_long *)local_158);
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_158);
      ppVar12 = (pointer)0xaf1463;
      if ((sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
           *)local_110._8_8_ !=
          (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
           *)0x0) {
        ppVar12 = *(pointer *)local_110._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x41f,(char *)ppVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if (local_158[0].first != (pair<int,_int>)0x0) {
        (**(code **)(*(long *)local_158[0].first + 8))();
      }
    }
    uVar2 = local_110._8_8_;
    if ((sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ !=
        (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      if (*(pointer *)local_110._8_8_ !=
          (pointer)&(((Settings *)(local_110._8_8_ + 8))->
                    super_alloc_impl<Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
                    ).
                    super_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>
                    .count_) {
        operator_delete(*(pointer *)local_110._8_8_);
      }
      operator_delete((void *)uVar2);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 1000);
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::begin((iterator *)local_110,&this_00->rep);
  pHVar1 = local_168;
  local_110._72_8_ = local_170;
  piVar6 = (iterator *)local_110;
  puVar8 = local_78;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar8 = piVar6->ht;
    piVar6 = (iterator *)((long)piVar6 + (ulong)bVar13 * -0x10 + 8);
    puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
  }
  local_c0.pos.row_begin._M_current =
       ((_Vector_impl_data *)
       ((long)&(local_168->
               super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ).
               super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.
               super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.table + 0x10))->_M_start;
  local_c0.pos.row_end._M_current =
       *(pointer *)
        ((long)&(local_168->
                super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x18);
  local_c0.pos.col_current = (nonempty_iterator)0x0;
  local_c0.end.col_current = (nonempty_iterator)0x0;
  local_c0.ht = &this_00->rep;
  local_c0.pos.row_current._M_current = local_c0.pos.row_end._M_current;
  local_c0.end.row_begin._M_current = local_c0.pos.row_begin._M_current;
  local_c0.end.row_end._M_current = local_c0.pos.row_end._M_current;
  local_c0.end.row_current._M_current = local_c0.pos.row_end._M_current;
  google::
  sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_c0);
  psVar7 = &local_c0;
  ppVar9 = local_158;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    ppVar9->first = (pair<int,_int>)psVar7->ht;
    psVar7 = (sparse_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)((long)psVar7 + (ulong)bVar13 * -0x10 + 8);
    ppVar9 = (pair<const_std::pair<int,_int>,_int> *)((long)ppVar9 + (ulong)bVar13 * -0x10 + 8);
  }
  puVar8 = local_78;
  puVar10 = (undefined8 *)&stack0xfffffffffffffdf8;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar10 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
  }
  ppVar9 = local_158;
  ppVar11 = (pair<int,_int> *)&stack0xfffffffffffffe40;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    *ppVar11 = ppVar9->first;
    ppVar9 = (pair<const_std::pair<int,_int>,_int> *)((long)ppVar9 + (ulong)bVar13 * -0x10 + 8);
    ppVar11 = ppVar11 + (ulong)bVar13 * -2 + 1;
  }
  google::
  sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe40);
  local_c0.ht = (sparse_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)((ulong)local_c0.ht & 0xffffffff00000000);
  local_158[0].first =
       (pair<int,_int>)
       (*(size_type *)
         ((long)&(pHVar1->
                 super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ).
                 super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.
                 super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.table + 0x40) -
       (pHVar1->
       super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_110,"0u","this->ht_.size()",(uint *)&local_c0,
             (unsigned_long *)local_158);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if ((sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ ==
        (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar12 = (pointer)0xaf1463;
    }
    else {
      ppVar12 = *(pointer *)local_110._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x422,(char *)ppVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_158[0].first != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_158[0].first + 8))();
    }
  }
  uVar2 = local_110._8_8_;
  if ((sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)local_110._8_8_ !=
      (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if (*(pointer *)local_110._8_8_ !=
        (pointer)&(((Settings *)(local_110._8_8_ + 8))->
                  super_alloc_impl<Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
                  ).
                  super_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete(*(pointer *)local_110._8_8_);
    }
    operator_delete((void *)uVar2);
  }
  local_158[0].first =
       *(pair<int,_int> *)
        ((long)&(pHVar1->
                super_HashtableAllTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ).
                super_HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.
                super_BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.table + 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_110,"old_count","this->ht_.bucket_count()",&local_160,
             (unsigned_long *)local_158);
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_158);
    if ((sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_110._8_8_ ==
        (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar12 = (pointer)0xaf1463;
    }
    else {
      ppVar12 = *(pointer *)local_110._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x423,(char *)ppVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_158[0].first != (pair<int,_int>)0x0) {
      (**(code **)(*(long *)local_158[0].first + 8))();
    }
  }
  if ((sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)local_110._8_8_ !=
      (sparsegroup<std::pair<const_std::pair<int,_int>,_int>,_(unsigned_short)48,_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if (*(pointer *)local_110._8_8_ !=
        (pointer)&(((Settings *)(local_110._8_8_ + 8))->
                  super_alloc_impl<Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>_>
                  ).
                  super_Alloc<std::pair<const_std::pair<int,_int>,_int>,_unsigned_long,_18446744073709551615UL>
                  .count_) {
      operator_delete(*(pointer *)local_110._8_8_);
    }
    operator_delete((void *)local_110._8_8_);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}